

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall Renderer::Render(Renderer *this)

{
  uint n_elements;
  float length;
  int iters;
  int h;
  int w;
  Camera *cam;
  Image image;
  float local_70;
  int local_6c;
  uint local_68;
  int local_64;
  Camera *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  Image local_38;
  
  local_64 = (this->_args).width;
  n_elements = (this->_args).height;
  local_6c = (this->_args).iters;
  local_70 = (this->_args).length;
  local_68 = n_elements;
  Image::Image(&local_38,local_64,n_elements);
  local_60 = (this->_scene)._camera;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x38);
  *(uint **)local_58._M_unused._0_8_ = &local_68;
  *(int **)((long)local_58._M_unused._0_8_ + 8) = &local_64;
  *(Camera ***)((long)local_58._M_unused._0_8_ + 0x10) = &local_60;
  *(Renderer **)((long)local_58._M_unused._0_8_ + 0x18) = this;
  *(float **)((long)local_58._M_unused._0_8_ + 0x20) = &local_70;
  *(int **)((long)local_58._M_unused._0_8_ + 0x28) = &local_6c;
  *(Image **)((long)local_58._M_unused._0_8_ + 0x30) = &local_38;
  local_40 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:220:21)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:220:21)>
             ::_M_manager;
  parallel_for(n_elements,(function<void_(int,_int)> *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((this->_args).output_file._M_string_length != 0) {
    Image::savePNG(&local_38,&(this->_args).output_file);
  }
  if (local_38._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Renderer::Render() {
    // Loop through all the pixels in the image
    // generate all the samples. Fetch necessary args.
    int w = _args.width;
    int h = _args.height;
    int iters = _args.iters;
    float length = _args.length;

    // This look generates camera rays and calls traceRay.
    // It also write to the color image.
    Image image(w, h);
    Camera *cam = _scene.getCamera();

    parallel_for(h, [&](int start, int end) {
        for (int i = start; i < end; ++i) {
            float ndcy = 2 * (i / (h - 1.0f)) - 1.0f;
            parallel_for(w, [&](int innerStart, int innerEnd) {
                for (int j = innerStart; j < innerEnd; ++j) {
                    // Use PerspectiveCamera to generate a ray.
                    float ndcx = 2 * (j / (w - 1.0f)) - 1.0f;
                    Ray r = cam->generateRay(Vector2f(ndcx, ndcy));
                    Vector3f color = estimatePixel(r, 0.01, length, iters);
                    image.setPixel(j, i, color);
                }
            }, true);
        }
    }, true);

    // Save the output file.
    if (!_args.output_file.empty()) {
        image.savePNG(_args.output_file);
    }
}